

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candump.c
# Opt level: O1

int sprint_timestamp(char *ts_buffer,char timestamp,timeval *tv,timeval *last_tv)

{
  int iVar1;
  tm *ptVar2;
  long lVar3;
  __suseconds_t _Var4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  undefined7 in_register_00000031;
  char *__format;
  char timestring [25];
  tm tm;
  char acStack_78 [32];
  tm local_58;
  
  pcVar6 = acStack_78;
  iVar7 = (int)CONCAT71(in_register_00000031,timestamp);
  iVar1 = 0;
  if (iVar7 < 100) {
    if (iVar7 == 0x41) {
      ptVar2 = localtime(&tv->tv_sec);
      local_58.tm_sec = ptVar2->tm_sec;
      local_58.tm_min = ptVar2->tm_min;
      local_58.tm_hour = ptVar2->tm_hour;
      local_58.tm_mday = ptVar2->tm_mday;
      local_58.tm_mon = ptVar2->tm_mon;
      local_58.tm_year = ptVar2->tm_year;
      local_58.tm_wday = ptVar2->tm_wday;
      local_58.tm_yday = ptVar2->tm_yday;
      local_58.tm_isdst = ptVar2->tm_isdst;
      local_58._36_4_ = *(undefined4 *)&ptVar2->field_0x24;
      local_58.tm_gmtoff = ptVar2->tm_gmtoff;
      local_58.tm_zone = ptVar2->tm_zone;
      strftime(acStack_78,0x18,"%Y-%m-%d %H:%M:%S",&local_58);
      _Var4 = tv->tv_usec;
      __format = "(%s.%06llu) ";
    }
    else {
      iVar1 = 0;
      if (iVar7 != 0x61) goto LAB_00103f2d;
      pcVar6 = (char *)tv->tv_sec;
      _Var4 = tv->tv_usec;
      __format = "(%010llu.%06llu) ";
    }
    iVar1 = sprintf(ts_buffer,__format,pcVar6,_Var4);
  }
  else if ((iVar7 == 100) || (iVar7 == 0x7a)) {
    if (last_tv->tv_sec == 0) {
      _Var4 = tv->tv_usec;
      last_tv->tv_sec = tv->tv_sec;
      last_tv->tv_usec = _Var4;
    }
    lVar5 = tv->tv_usec - last_tv->tv_usec;
    lVar3 = lVar5 + 1000000;
    if (-1 < lVar5) {
      lVar3 = lVar5;
    }
    lVar5 = (lVar5 >> 0x3f) + (tv->tv_sec - last_tv->tv_sec);
    if (lVar5 < 0) {
      lVar3 = 0;
    }
    if (lVar5 < 1) {
      lVar5 = 0;
    }
    iVar1 = sprintf(ts_buffer,"(%03llu.%06llu) ",lVar5,lVar3);
    if (timestamp == 'd') {
      _Var4 = tv->tv_usec;
      last_tv->tv_sec = tv->tv_sec;
      last_tv->tv_usec = _Var4;
    }
  }
LAB_00103f2d:
  if (iVar1 < 1) {
    *ts_buffer = '\0';
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int sprint_timestamp(char *ts_buffer, const char timestamp,
			    const struct timeval *tv, struct timeval *const last_tv)
{
	int numchars = 0;

	switch (timestamp) {
	case 'a': /* absolute with timestamp */
		numchars = sprintf(ts_buffer, "(%010llu.%06llu) ",
				   (unsigned long long)tv->tv_sec,
				   (unsigned long long)tv->tv_usec);
		break;

	case 'A': /* absolute with date */
	{
		struct tm tm;
		char timestring[25];

		tm = *localtime(&tv->tv_sec);
		strftime(timestring, 24, "%Y-%m-%d %H:%M:%S", &tm);
		numchars = sprintf(ts_buffer, "(%s.%06llu) ", timestring,
				   (unsigned long long)tv->tv_usec);
	}
	break;

	case 'd': /* delta */
	case 'z': /* starting with zero */
	{
		struct timeval diff;

		if (last_tv->tv_sec == 0) /* first init */
			*last_tv = *tv;
		diff.tv_sec = tv->tv_sec - last_tv->tv_sec;
		diff.tv_usec = tv->tv_usec - last_tv->tv_usec;
		if (diff.tv_usec < 0)
			diff.tv_sec--, diff.tv_usec += 1000000;
		if (diff.tv_sec < 0)
			diff.tv_sec = diff.tv_usec = 0;
		numchars = sprintf(ts_buffer, "(%03llu.%06llu) ",
				   (unsigned long long)diff.tv_sec,
				   (unsigned long long)diff.tv_usec);

		if (timestamp == 'd')
			*last_tv = *tv; /* update for delta calculation */
	}
	break;

	default: /* no timestamp output */
		break;
	}

	if (numchars <= 0) {
		ts_buffer[0] = 0; /* empty terminated string */
		numchars = 0;
	}

	return numchars;
}